

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O1

void __thiscall
indigox::algorithm::AStarOptimisation::GenerateNeighbourDistributions
          (AStarOptimisation *this,p_AStarQueueItem *d,
          vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *out_nbrs)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  element_type *__x;
  ElnDist nbr;
  value_type local_48;
  
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_erase_at_end(out_nbrs,(out_nbrs->
                             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  __x = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr;
  uVar2 = 0;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_48.m_bits,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x);
    local_48.m_num_bits = (__x->distribution).m_num_bits;
    if ((char)uVar2 != '\0') {
      uVar3 = (ulong)((d->
                      super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->nbr_start_idx;
      uVar4 = uVar2 & 0xff;
      do {
        local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3 >> 6] =
             local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3 >> 6] | 1L << ((byte)uVar3 & 0x3f);
        uVar3 = uVar3 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::push_back(out_nbrs,&local_48);
    if (local_48.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    uVar1 = (int)(uVar2 & 0xff) + 1;
    uVar2 = (ulong)uVar1;
    __x = (d->super___shared_ptr<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr;
  } while ((byte)uVar1 <= __x->nbr_count);
  return;
}

Assistant:

void AStarOptimisation::GenerateNeighbourDistributions(p_AStarQueueItem d, std::vector<ElnDist> *out_nbrs) {
  out_nbrs->clear();
  for (uint8_t i = 0; i <= d->nbr_count; ++i) {
    ElnDist nbr = ElnDist(d->distribution);
    for (uint8_t j = 0; j < i; ++j) {
      nbr.set(j + d->nbr_start_idx);
    }
    out_nbrs->push_back(nbr);
  }
}